

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

void do_movz_zpz(DisasContext_conflict1 *s,int rd,int rn,int pg,int esz)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint32_t oprsz;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  int esz_local;
  int pg_local;
  int rn_local;
  int rd_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  oprsz = vec_full_reg_size(s);
  dofs = vec_full_reg_offset(s,rd);
  aofs = vec_full_reg_offset(s,rn);
  bofs = pred_full_reg_offset(s,pg);
  tcg_gen_gvec_3_ool_aarch64
            (tcg_ctx_00,dofs,aofs,bofs,oprsz,oprsz,0,
             (gen_helper_gvec_3_conflict1 *)do_movz_zpz::fns[esz]);
  return;
}

Assistant:

static void do_movz_zpz(DisasContext *s, int rd, int rn, int pg, int esz)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_3 * const fns[4] = {
        gen_helper_sve_movz_b, gen_helper_sve_movz_h,
        gen_helper_sve_movz_s, gen_helper_sve_movz_d,
    };
    unsigned vsz = vec_full_reg_size(s);
    tcg_gen_gvec_3_ool(tcg_ctx, vec_full_reg_offset(s, rd),
                       vec_full_reg_offset(s, rn),
                       pred_full_reg_offset(s, pg),
                       vsz, vsz, 0, fns[esz]);
}